

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadnames.cpp
# Opt level: O2

string * util::ThreadGetInternalName_abi_cxx11_(void)

{
  string *in_RDI;
  long *in_FS_OFFSET;
  allocator<char> local_11;
  long local_10;
  
  local_10 = in_FS_OFFSET[5];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,(char *)(*in_FS_OFFSET + -0x80),&local_11);
  if (in_FS_OFFSET[5] == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string util::ThreadGetInternalName() { return g_thread_name; }